

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void scale_patch_internal(double alpha,int ndim,double *patch1,int *lo1,int *hi1,int *dims1)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int subscr1 [7];
  int local_48 [10];
  
  uVar1 = (ulong)(uint)ndim;
  iVar5 = 1;
  if (0 < ndim) {
    uVar6 = 0;
    do {
      iVar2 = hi1[uVar6] - lo1[uVar6];
      if (dims1[uVar6] <= iVar2) {
        __assert_fail("diff < dims1[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0x13a,"void scale_patch_internal(double, int, double *, int *, int *, int *)"
                     );
      }
      iVar5 = iVar5 * (iVar2 + 1);
      local_48[uVar6] = lo1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  if (0 < iVar5) {
    uVar6 = 0;
    iVar2 = 0;
    do {
      uVar3 = 0;
      if (0 < ndim) {
        iVar4 = 1;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + local_48[uVar3] * iVar4;
          iVar4 = iVar4 * dims1[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        uVar3 = (ulong)iVar7;
      }
      if (iVar2 == 0) {
        uVar6 = uVar3;
      }
      patch1[uVar3 - uVar6] = patch1[uVar3 - uVar6] * alpha;
      if (0 < ndim) {
        uVar3 = 0;
        do {
          if (local_48[uVar3] < hi1[uVar3]) {
            local_48[uVar3] = local_48[uVar3] + 1;
            break;
          }
          local_48[uVar3] = lo1[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar5);
  }
  return;
}

Assistant:

void scale_patch_internal(double alpha, int ndim, double *patch1, 
                 int lo1[], int hi1[], int dims1[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM];
    Integer idx1, offset1=0;

    for(i=0;i<ndim;i++){   /* count # of elements in patch */
        int diff = hi1[i]-lo1[i];
        assert(diff < dims1[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
    }

    /* scale element values in both patches */ 
    for(j=0; j< elems; j++){ 
        
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    

        if(j==0){
            offset1 =idx1;
        }
        idx1 -= offset1;

        patch1[idx1] *= alpha;
        update_subscript(ndim, subscr1, lo1,hi1, dims1);
    }    
}